

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_find_all_in_snapshot
               (uchar *buf,cali_id_t attr_id,size_t *bytes_read,cali_entry_proc_fn proc_fn,
               void *user_arg)

{
  UnpackAttributeEntryOp fn;
  CompressedSnapshotRecordView local_98;
  undefined1 local_70 [8];
  Caliper c;
  UnpackAttributeEntryOp op;
  size_t pos;
  void *user_arg_local;
  cali_entry_proc_fn proc_fn_local;
  size_t *bytes_read_local;
  cali_id_t attr_id_local;
  uchar *buf_local;
  
  op.m_id = 0;
  anon_unknown.dwarf_3c2cdc::UnpackAttributeEntryOp::UnpackAttributeEntryOp
            ((UnpackAttributeEntryOp *)&c.m_is_signal,attr_id,proc_fn,user_arg);
  cali::Caliper::Caliper((Caliper *)local_70);
  cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView(&local_98,buf,&op.m_id);
  fn.m_fn = (cali_entry_proc_fn)op.m_arg;
  fn.m_arg = (void *)c._24_8_;
  fn.m_id = (cali_id_t)op.m_fn;
  cali::CompressedSnapshotRecordView::unpack<(anonymous_namespace)::UnpackAttributeEntryOp>
            (&local_98,(CaliperMetadataAccessInterface *)local_70,fn);
  cali::CompressedSnapshotRecordView::~CompressedSnapshotRecordView(&local_98);
  if (bytes_read != (size_t *)0x0) {
    *bytes_read = op.m_id + *bytes_read;
  }
  cali::Caliper::~Caliper((Caliper *)local_70);
  return;
}

Assistant:

void cali_find_all_in_snapshot(
    const unsigned char* buf,
    cali_id_t            attr_id,
    size_t*              bytes_read,
    cali_entry_proc_fn   proc_fn,
    void*                user_arg
)
{
    size_t                   pos = 0;
    ::UnpackAttributeEntryOp op(attr_id, proc_fn, user_arg);

    // FIXME: Need sigsafe instance? Only does read-only
    // node-by-id lookup though, so we should be safe
    Caliper c;

    CompressedSnapshotRecordView(buf, &pos).unpack(&c, op);

    if (bytes_read)
        *bytes_read += pos;
}